

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VDotProdMultiLocal(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  sunrealtype dotprods [3];
  timespec spec_1;
  timespec local_58;
  undefined8 local_48;
  timespec local_40;
  
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,X);
  N_VConst(0x4000000000000000,X);
  N_VConst(0x3fe0000000000000,*puVar4);
  iVar7 = 1;
  clock_gettime(1,&local_58);
  lVar5 = local_58.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_58.tv_nsec;
  iVar1 = N_VDotProdMultiLocal(1,X,puVar4,&local_58);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar6 = local_40.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_40.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = SUNRCompare(local_58.tv_sec,(double)param_2);
    if (iVar1 != 0) goto LAB_0010fb75;
    iVar7 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VDotProdMultiLocal Case 1 ");
    }
  }
  else {
LAB_0010fb75:
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 1, Proc %d \n",(ulong)(uint)myid);
  }
  max_time(X,(dVar9 / 1000000000.0 + (double)lVar6) - (dVar8 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiLocal");
  }
  N_VConst(0x4000000000000000,X);
  N_VConst(0xbfe0000000000000,*puVar4);
  N_VConst(0x3fe0000000000000,puVar4[1]);
  N_VConst(0x3ff0000000000000,puVar4[2]);
  clock_gettime(1,&local_40);
  lVar5 = local_40.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_40.tv_nsec;
  iVar1 = N_VDotProdMultiLocal(3,X,puVar4,&local_58);
  sync_device(X);
  clock_gettime(1,&local_40);
  lVar6 = local_40.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    dVar9 = (double)param_2;
    iVar1 = SUNRCompare(local_58.tv_sec,-dVar9);
    iVar2 = SUNRCompare(local_58.tv_nsec,dVar9);
    iVar3 = SUNRCompare(local_48,dVar9 + dVar9);
    if (iVar3 + iVar2 + iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VDotProdMultiLocal Case 2 ");
      }
      goto LAB_0010fd1f;
    }
  }
  printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n",(ulong)(uint)myid);
  iVar7 = iVar7 + 1;
LAB_0010fd1f:
  max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar6) -
             (dVar8 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiLocal");
  }
  N_VDestroyVectorArray(puVar4,3);
  return iVar7;
}

Assistant:

int Test_N_VDotProdMultiLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  N_Vector* V;
  sunrealtype dotprods[3];

  /* create vectors for testing */
  V = N_VCloneVectorArray(3, X);

  /*
   * Case 1: d[0] = z . V[0], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, V[0]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(1, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[0] should equal the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /*
   * Case 2: d[i] = z . V[i], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(NEG_HALF, V[0]);
  N_VConst(HALF, V[1]);
  N_VConst(ONE, V[2]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(3, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[i] should equal -1, +1, and 2 times the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)-1 * local_length);
    failure += SUNRCompare(dotprods[1], (sunrealtype)local_length);
    failure += SUNRCompare(dotprods[2], (sunrealtype)2 * local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(V, 3);

  return (fails);
}